

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BristolCircuit.cpp
# Opt level: O2

void __thiscall
Circuit::base_circuit_shares
          (Circuit *this,
          vector<std::array<unsigned_long,_1UL>,_std::allocator<std::array<unsigned_long,_1UL>_>_>
          *witness_shares_in,
          vector<std::array<unsigned_long,_1UL>,_std::allocator<std::array<unsigned_long,_1UL>_>_>
          *output_mult_shares,
          vector<std::array<unsigned_long,_1UL>,_std::allocator<std::array<unsigned_long,_1UL>_>_>
          *witness_shares_out,
          vector<std::array<unsigned_long,_1UL>,_std::allocator<std::array<unsigned_long,_1UL>_>_>
          *right_input_mult_shares_out,
          vector<std::array<unsigned_long,_1UL>,_std::allocator<std::array<unsigned_long,_1UL>_>_>
          *left_input_mult_shares_out)

{
  pointer puVar1;
  pointer puVar2;
  pointer paVar3;
  pointer pGVar4;
  pointer pGVar5;
  pointer pvVar6;
  pointer pvVar7;
  pointer paVar8;
  pointer paVar9;
  uint *puVar10;
  long lVar11;
  pointer pvVar12;
  long lVar13;
  runtime_error *this_00;
  ulong uVar14;
  uint uVar15;
  uint uVar16;
  uint uVar17;
  uint uVar18;
  uint uVar19;
  ulong uVar20;
  long lVar21;
  ulong uVar22;
  bool bVar23;
  allocator_type local_79;
  Circuit *local_78;
  vector<unsigned_long,_std::allocator<unsigned_long>_> W;
  
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            (&W,(ulong)this->nWires,&local_79);
  puVar1 = (this->numI).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_start;
  puVar2 = (this->numI).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_finish;
  uVar16 = 0;
  for (uVar15 = 0; (ulong)uVar15 < (ulong)((long)puVar2 - (long)puVar1 >> 2); uVar15 = uVar15 + 1) {
    uVar18 = puVar1[uVar15];
    paVar3 = (witness_shares_in->
             super__Vector_base<std::array<unsigned_long,_1UL>,_std::allocator<std::array<unsigned_long,_1UL>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    uVar17 = uVar16 + uVar18;
    while (bVar23 = uVar18 != 0, uVar18 = uVar18 - 1, bVar23) {
      W.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start[uVar16] = paVar3[uVar16]._M_elems[0];
      uVar16 = uVar16 + 1;
    }
    uVar16 = uVar17;
  }
  pGVar4 = (this->GateT).super__Vector_base<GateType,_std::allocator<GateType>_>._M_impl.
           super__Vector_impl_data._M_start;
  pGVar5 = (this->GateT).super__Vector_base<GateType,_std::allocator<GateType>_>._M_impl.
           super__Vector_impl_data._M_finish;
  pvVar6 = (this->GateI).
           super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pvVar7 = (this->GateO).
           super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  paVar3 = (right_input_mult_shares_out->
           super__Vector_base<std::array<unsigned_long,_1UL>,_std::allocator<std::array<unsigned_long,_1UL>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  paVar8 = (left_input_mult_shares_out->
           super__Vector_base<std::array<unsigned_long,_1UL>,_std::allocator<std::array<unsigned_long,_1UL>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  paVar9 = (output_mult_shares->
           super__Vector_base<std::array<unsigned_long,_1UL>,_std::allocator<std::array<unsigned_long,_1UL>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  uVar14 = 0;
  uVar16 = 0;
  do {
    uVar22 = (ulong)uVar16;
    local_78 = this;
    if ((ulong)((long)pGVar5 - (long)pGVar4 >> 2) <= uVar22) {
      uVar16 = this->nWires;
      puVar1 = (this->numO).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_start;
      uVar14 = (long)(this->numO).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                     _M_impl.super__Vector_impl_data._M_finish - (long)puVar1 >> 2;
      for (uVar15 = 0; uVar15 < uVar14; uVar15 = uVar15 + 1) {
        uVar16 = uVar16 - puVar1[uVar15];
      }
      uVar15 = 0;
      for (uVar17 = 0; uVar17 < uVar14; uVar17 = uVar17 + 1) {
        uVar19 = puVar1[uVar17];
        paVar3 = (witness_shares_out->
                 super__Vector_base<std::array<unsigned_long,_1UL>,_std::allocator<std::array<unsigned_long,_1UL>_>_>
                 )._M_impl.super__Vector_impl_data._M_start;
        uVar18 = uVar15 + uVar19;
        while (bVar23 = uVar19 != 0, uVar19 = uVar19 - 1, bVar23) {
          paVar3[uVar15]._M_elems[0] =
               W.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_start[uVar16];
          uVar16 = uVar16 + 1;
          uVar15 = uVar15 + 1;
        }
        uVar15 = uVar18;
      }
      std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
                (&W.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
      return;
    }
    switch(pGVar4[uVar22]) {
    case XOR:
      puVar10 = pvVar6[uVar22].super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                _M_impl.super__Vector_impl_data._M_start;
      uVar20 = W.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_start[puVar10[1]] ^
               W.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_start[*puVar10];
      break;
    case AND:
      puVar10 = pvVar6[uVar22].super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                _M_impl.super__Vector_impl_data._M_start;
      paVar3[uVar14]._M_elems[0] =
           W.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_start[*puVar10];
      paVar8[uVar14]._M_elems[0] =
           W.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_start[puVar10[1]];
      W.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start
      [*pvVar7[uVar22].super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_start] = paVar9[uVar14]._M_elems[0];
      uVar14 = (ulong)((int)uVar14 + 1);
      goto LAB_001041ae;
    case INV:
      uVar20 = W.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_start
               [*pvVar6[uVar22].super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                 _M_impl.super__Vector_impl_data._M_start] ^ 1;
      break;
    case EQ:
      uVar20 = (ulong)*pvVar6[uVar22].
                       super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                       super__Vector_impl_data._M_start;
      break;
    case EQW:
      uVar20 = W.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_start
               [*pvVar6[uVar22].super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                 _M_impl.super__Vector_impl_data._M_start];
      break;
    case MAND:
      lVar11 = *(long *)&pvVar7[uVar22].
                         super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                         super__Vector_impl_data;
      lVar21 = (long)*(pointer *)
                      ((long)&pvVar7[uVar22].
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data + 8) - lVar11;
      pvVar12 = (this->GateI).
                super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      for (uVar15 = 0; uVar20 = (ulong)uVar15, uVar20 < (ulong)(lVar21 >> 2); uVar15 = uVar15 + 1) {
        lVar13 = *(long *)&pvVar12[uVar22].
                           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                           super__Vector_impl_data;
        W.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start[*(uint *)(lVar11 + uVar20 * 4)] =
             W.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_start[*(uint *)(lVar21 + lVar13 + uVar20 * 4)] &
             W.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_start[*(uint *)(lVar13 + uVar20 * 4)];
      }
      goto LAB_001041ae;
    default:
      this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(this_00,"not_implemented");
      __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    W.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_start
    [*pvVar7[uVar22].super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start] = uVar20;
LAB_001041ae:
    uVar16 = uVar16 + 1;
  } while( true );
}

Assistant:

void Circuit::base_circuit_shares(
    const std::vector<std::array<uint64_t, PARTY64>> &witness_shares_in,
    const std::vector<std::array<uint64_t, PARTY64>> &output_mult_shares,
    std::vector<std::array<uint64_t, PARTY64>> &witness_shares_out,
    std::vector<std::array<uint64_t, PARTY64>> &right_input_mult_shares_out,
    std::vector<std::array<uint64_t, PARTY64>> &left_input_mult_shares_out)
    const {
  vector<uint64_t> W(nWires);
  for (unsigned int p = 0; p < PARTY64; p++) {
    unsigned int cntAND = 0;
    // Load inputs
    unsigned int cnt = 0;
    for (unsigned int i = 0; i < numI.size(); i++) {
      for (unsigned int j = 0; j < numI[i]; j++) {
        W[cnt] = witness_shares_in[cnt][p];
        cnt++;
      }
    }
    // Evaluate the circuit
    for (unsigned int i = 0; i < GateT.size();
         i++) { // First check if ordering is broken
      // if (GateT[i] != EQ && W[GateI[i][0]] < 0)
      //  {
      //    throw std::runtime_error("Circuit error");
      //  }
      // if (GateT[i] != INV && GateT[i] != EQ && GateT[i] != EQW)
      //  {
      //    for (unsigned int j= 1; j < GateO[i].size(); j++)
      //      {
      //        if (W[GateI[i][j]] < 0)
      //          {
      //            throw std::runtime_error("Circuit error");
      //          }
      //      }
      //  }
      // Now evaluate the gate
      if (GateT[i] == AND) {
        right_input_mult_shares_out[cntAND][p] = W[GateI[i][0]];
        left_input_mult_shares_out[cntAND][p] = W[GateI[i][1]];
        W[GateO[i][0]] = output_mult_shares[cntAND][p];
        cntAND++;
      } else if (GateT[i] == MAND) {
        for (unsigned int j = 0; j < GateO[i].size(); j++) {
          W[GateO[i][j]] = W[GateI[i][j]] & W[GateI[i][j + GateO[i].size()]];
        }
      } else if (GateT[i] == XOR) {
        W[GateO[i][0]] = W[GateI[i][0]] ^ W[GateI[i][1]];
      } else if (GateT[i] == EQ) {
        W[GateO[i][0]] = GateI[i][0];
      } else if (GateT[i] == EQW) {
        W[GateO[i][0]] = W[GateI[i][0]];
      } else if (GateT[i] == INV) {
        W[GateO[i][0]] = 1 ^ W[GateI[i][0]];
      } else {
        throw std::runtime_error("not_implemented");
      }
    }
    // Now produce the output
    // outputs.resize(total_num_out());
    cnt = nWires;
    unsigned int cntOut = 0;
    for (unsigned int i = 0; i < numO.size(); i++) {
      cnt -= numO[i];
    }
    for (unsigned int i = 0; i < numO.size(); i++) {
      // outputs[i].resize(numO[i]);
      for (unsigned int j = 0; j < numO[i]; j++) {
        witness_shares_out[cntOut][p] = W[cnt];
        cnt++;
        cntOut++;
      }
    }
  }
}